

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

void __thiscall LinkedObjectFile::find_code(LinkedObjectFile *this)

{
  vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  uint32_t *puVar1;
  uint uVar2;
  pointer pLVar3;
  pointer pvVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  reference pvVar9;
  size_type __n;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  value_type vVar13;
  pointer pLVar14;
  size_t j;
  ulong uVar15;
  size_type __n_00;
  
  iVar8 = this->segments;
  if (iVar8 != 0) {
    if (iVar8 == 1) {
      pvVar4 = (this->words_by_seg).
               super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar3 = *(pointer *)
                ((long)&(pvVar4->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                        _M_impl.super__Vector_impl_data + 8);
      for (pLVar14 = (pvVar4->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl.
                     super__Vector_impl_data._M_start; pLVar14 != pLVar3; pLVar14 = pLVar14 + 1) {
        if ((pLVar14->symbol_name)._M_string_length != 0) {
          bVar7 = std::operator!=(&pLVar14->symbol_name,"function");
          if (!bVar7) {
            __assert_fail("word.symbol_name != \"function\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                          ,0x122,"void LinkedObjectFile::find_code()");
          }
        }
      }
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          (&this->offset_of_data_zone_by_seg,0);
      *pvVar11 = 0;
      pvVar4 = (this->words_by_seg).
               super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->stats).data_bytes =
           (int)(((long)*(pointer *)
                         ((long)&(pvVar4->
                                 super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                                 _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar4->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                           _M_impl.super__Vector_impl_data) / 0x30) << 2;
      (this->stats).code_bytes = 0;
    }
    else {
      if (iVar8 != 3) {
        __assert_fail("segments == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0x167,"void LinkedObjectFile::find_code()");
      }
      this_00 = &this->words_by_seg;
      this_01 = &this->offset_of_data_zone_by_seg;
      iVar8 = 3;
      for (__n_00 = 0; (long)__n_00 < (long)iVar8; __n_00 = __n_00 + 1) {
        pvVar9 = std::
                 vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ::at(this_00,__n_00);
        __n = ((long)(pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl.
                    super__Vector_impl_data._M_start) / 0x30;
        do {
          do {
            __n = __n - 1;
            if (__n == 0xffffffffffffffff) {
              vVar13 = 0;
              goto LAB_0013a661;
            }
            pvVar9 = std::
                     vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     ::at(this_00,__n_00);
            pvVar10 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at(pvVar9,__n);
          } while (pvVar10->kind != TYPE_PTR);
          bVar7 = std::operator==(&pvVar10->symbol_name,"function");
        } while (!bVar7);
        bVar7 = false;
        uVar15 = 0xffffffffffffffff;
        while( true ) {
          pvVar9 = std::
                   vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ::at(this_00,__n_00);
          if ((ulong)(((long)(pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                            _M_impl.super__Vector_impl_data._M_start) / 0x30) <= __n) break;
          pvVar9 = std::
                   vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ::at(this_00,__n_00);
          pvVar10 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at(pvVar9,__n);
          bVar5 = pvVar10->data == 0x3e00008;
          bVar6 = pvVar10->kind == PLAIN_DATA;
          if (bVar5 && bVar6) {
            uVar15 = __n;
          }
          bVar7 = (bool)(bVar7 | (bVar5 && bVar6));
          __n = __n + 1;
        }
        if (!bVar7) {
          __assert_fail("found_jr_ra",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x14a,"void LinkedObjectFile::find_code()");
        }
        pvVar9 = std::
                 vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ::at(this_00,__n_00);
        if ((ulong)(((long)(pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                          _M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar15 + 1) {
          __assert_fail("jr_ra_loc + 1 < words_by_seg.at(i).size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x14b,"void LinkedObjectFile::find_code()");
        }
        vVar13 = (int)uVar15 + 2;
LAB_0013a661:
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,__n_00);
        *pvVar11 = vVar13;
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,__n_00);
        uVar2 = *pvVar11;
        pvVar9 = std::
                 vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ::at(this_00,__n_00);
        if ((ulong)uVar2 <
            (ulong)(((long)(pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                          _M_impl.super__Vector_impl_data._M_start) / 0x30)) {
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,__n_00);
          iVar8 = get_label_id_for(this,(int)__n_00,*pvVar11 << 2);
          pvVar12 = std::vector<Label,_std::allocator<Label>_>::at(&this->labels,(long)iVar8);
          std::__cxx11::string::assign((char *)pvVar12);
        }
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,__n_00);
        uVar15 = (ulong)*pvVar11;
        while( true ) {
          pvVar9 = std::
                   vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ::at(this_00,__n_00);
          pLVar14 = (pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          pLVar3 = (pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar9 = std::
                   vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ::at(this_00,__n_00);
          if ((ulong)(((long)pLVar14 - (long)pLVar3) / 0x30) <= uVar15) break;
          pvVar10 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at(pvVar9,uVar15);
          if (pvVar10->kind == TYPE_PTR) {
            bVar7 = std::operator==(&pvVar10->symbol_name,"function");
            if (bVar7) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                            ,0x15d,"void LinkedObjectFile::find_code()");
            }
          }
          uVar15 = uVar15 + 1;
        }
        pLVar14 = (pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        pLVar3 = (pvVar9->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,__n_00);
        puVar1 = &(this->stats).data_bytes;
        *puVar1 = *puVar1 + ((int)(((long)pLVar14 - (long)pLVar3) / 0x30) - *pvVar11) * 0x10;
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,__n_00);
        puVar1 = &(this->stats).code_bytes;
        *puVar1 = *puVar1 + *pvVar11 * 4;
        iVar8 = this->segments;
      }
    }
  }
  return;
}

Assistant:

void LinkedObjectFile::find_code() {
  if (segments == 1) {
    // single segment object files should never have any code.
    auto& seg = words_by_seg.front();
    for (auto& word : seg) {
      if (!word.symbol_name.empty()) {
        assert(word.symbol_name != "function");
      }
    }
    offset_of_data_zone_by_seg.at(0) = 0;
    stats.data_bytes = words_by_seg.front().size() * 4;
    stats.code_bytes = 0;

  } else if (segments == 3) {
    // V3 object files will have all the functions, then all the static data.  So to find the
    // divider, we look for the last "function" tag, then find the last jr $ra instruction after
    // that (plus one for delay slot) and assume that after that is data.  Additionally, we check to
    // make sure that there are no "function" type tags in the data section, although this is
    // redundant.
    for (int i = 0; i < segments; i++) {
      // try to find the last reference to "function":
      bool found_function = false;
      size_t function_loc = -1;
      for (size_t j = words_by_seg.at(i).size(); j-- > 0;) {
        auto& word = words_by_seg.at(i).at(j);
        if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
          function_loc = j;
          found_function = true;
          break;
        }
      }

      if (found_function) {
        // look forward until we find "jr ra"
        const uint32_t jr_ra = 0x3e00008;
        bool found_jr_ra = false;
        size_t jr_ra_loc = -1;

        for (size_t j = function_loc; j < words_by_seg.at(i).size(); j++) {
          auto& word = words_by_seg.at(i).at(j);
          if (word.kind == LinkedWord::PLAIN_DATA && word.data == jr_ra) {
            found_jr_ra = true;
            jr_ra_loc = j;
          }
        }

        assert(found_jr_ra);
        assert(jr_ra_loc + 1 < words_by_seg.at(i).size());
        offset_of_data_zone_by_seg.at(i) = jr_ra_loc + 2;

      } else {
        // no functions
        offset_of_data_zone_by_seg.at(i) = 0;
      }

      // add label for debug purposes
      if (offset_of_data_zone_by_seg.at(i) < words_by_seg.at(i).size()) {
        auto data_label_id = get_label_id_for(i, 4 * (offset_of_data_zone_by_seg.at(i)));
        labels.at(data_label_id).name = "L-data-start";
      }

      // verify there are no functions after the data section starts
      for (size_t j = offset_of_data_zone_by_seg.at(i); j < words_by_seg.at(i).size(); j++) {
        auto& word = words_by_seg.at(i).at(j);
        if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
          assert(false);
        }
      }

      // sizes:
      stats.data_bytes += 4 * (words_by_seg.at(i).size() - offset_of_data_zone_by_seg.at(i)) * 4;
      stats.code_bytes += 4 * offset_of_data_zone_by_seg.at(i);
    }
  } else {
    // for files which we couldn't extract link data yet, they will have 0 segments and its ok.
    assert(segments == 0);
  }
}